

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FontEffectOutline.cpp
# Opt level: O0

SharedPtr<FontEffect> __thiscall
Rml::FontEffectOutlineInstancer::InstanceFontEffect
          (FontEffectOutlineInstancer *this,String *param_1,PropertyDictionary *properties)

{
  bool bVar1;
  Property *pPVar2;
  element_type *peVar3;
  PropertyDictionary *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  SharedPtr<FontEffect> SVar4;
  undefined1 local_40 [8];
  SharedPtr<Rml::FontEffectOutline> font_effect;
  Colourb color;
  float width;
  PropertyDictionary *properties_local;
  String *param_1_local;
  FontEffectOutlineInstancer *this_local;
  
  pPVar2 = PropertyDictionary::GetProperty(in_RCX,param_1[4].field_2._M_local_buf[0]);
  font_effect.super___shared_ptr<Rml::FontEffectOutline,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._4_4_ = Property::Get<float>(pPVar2);
  pPVar2 = PropertyDictionary::GetProperty(in_RCX,param_1[4].field_2._M_local_buf[1]);
  font_effect.super___shared_ptr<Rml::FontEffectOutline,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._0_4_ = Property::Get<Rml::Colour<unsigned_char,255,false>>(pPVar2);
  MakeShared<Rml::FontEffectOutline>();
  peVar3 = ::std::
           __shared_ptr_access<Rml::FontEffectOutline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Rml::FontEffectOutline,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_40);
  bVar1 = FontEffectOutline::Initialise
                    (peVar3,(int)font_effect.
                                 super___shared_ptr<Rml::FontEffectOutline,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi._4_4_);
  if (bVar1) {
    peVar3 = ::std::
             __shared_ptr_access<Rml::FontEffectOutline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Rml::FontEffectOutline,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_40);
    FontEffect::SetColour
              (&peVar3->super_FontEffect,
               font_effect.super___shared_ptr<Rml::FontEffectOutline,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._0_4_);
    ::std::shared_ptr<Rml::FontEffect>::shared_ptr<Rml::FontEffectOutline,void>
              ((shared_ptr<Rml::FontEffect> *)this,(shared_ptr<Rml::FontEffectOutline> *)local_40);
  }
  else {
    ::std::shared_ptr<Rml::FontEffect>::shared_ptr
              ((shared_ptr<Rml::FontEffect> *)this,(nullptr_t)0x0);
  }
  ::std::shared_ptr<Rml::FontEffectOutline>::~shared_ptr
            ((shared_ptr<Rml::FontEffectOutline> *)local_40);
  SVar4.super___shared_ptr<Rml::FontEffect,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  SVar4.super___shared_ptr<Rml::FontEffect,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (SharedPtr<FontEffect>)
         SVar4.super___shared_ptr<Rml::FontEffect,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

SharedPtr<FontEffect> FontEffectOutlineInstancer::InstanceFontEffect(const String& /*name*/, const PropertyDictionary& properties)
{
	float width = properties.GetProperty(id_width)->Get<float>();
	Colourb color = properties.GetProperty(id_color)->Get<Colourb>();

	auto font_effect = MakeShared<FontEffectOutline>();
	if (font_effect->Initialise(int(width)))
	{
		font_effect->SetColour(color);
		return font_effect;
	}

	return nullptr;
}